

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O3

nh_bool find_race(nh_roles_info *ri,char *race_str,int *out_race)

{
  int iVar1;
  char **ppcVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = ri->num_races;
  if (0 < (long)iVar1) {
    ppcVar2 = ri->racenames;
    lVar4 = 0;
    do {
      iVar3 = strcmp(race_str,ppcVar2[lVar4]);
      if (iVar3 == 0) {
        *out_race = (int)lVar4;
        return '\x01';
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return '\0';
}

Assistant:

static nh_bool find_race(const struct nh_roles_info *ri,
			 const char *race_str, int *out_race)
{
    int i;

    for (i = 0; i < ri->num_races; i++) {
	if (!strcmp(race_str, ri->racenames[i])) {
	    *out_race = i;
	    return TRUE;
	}
    }
    return FALSE;
}